

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitio.cpp
# Opt level: O1

ssize_t __thiscall
bitio::bitio_stream::read(bitio_stream *this,int __fd,void *__buf,size_t __nbytes)

{
  byte bVar1;
  uint64_t uVar2;
  size_t sVar3;
  sbyte sVar4;
  byte bVar5;
  byte bVar6;
  char cVar7;
  ulong uVar8;
  bool bVar9;
  
  if (__fd != 0) {
    bVar6 = (byte)__fd;
    if (this->bit_count == '\0') {
      if (this->eof == true) {
        this->bit_buffer = '\0';
      }
      if (this->byte_index == this->current_buffer_length) {
        sVar3 = fread(this->byte_buffer,1,this->buffer_size,(FILE *)this->file);
        bVar9 = sVar3 == 0;
        if (bVar9) {
          sVar3 = this->current_buffer_length;
        }
        this->current_buffer_length = sVar3;
        this->eof = bVar9;
        this->byte_index = 0;
      }
      uVar2 = this->byte_index;
      this->byte_index = uVar2 + 1;
      this->bit_buffer = this->byte_buffer[uVar2];
      this->bit_count = '\b';
    }
    bVar5 = this->bit_count;
    if (bVar5 < bVar6) {
      uVar8 = (ulong)(this->bit_buffer >> (8 - bVar5 & 0x1f));
      bVar6 = bVar6 - bVar5;
      this->bit_buffer = '\0';
      this->bit_count = '\0';
      if (7 < bVar6) {
        cVar7 = (char)bVar6 >> 3;
        do {
          if (this->eof == true) {
            this->bit_buffer = '\0';
          }
          if (this->byte_index == this->current_buffer_length) {
            sVar3 = fread(this->byte_buffer,1,this->buffer_size,(FILE *)this->file);
            bVar9 = sVar3 == 0;
            if (bVar9) {
              sVar3 = this->current_buffer_length;
            }
            this->current_buffer_length = sVar3;
            this->eof = bVar9;
            this->byte_index = 0;
          }
          cVar7 = cVar7 + -1;
          uVar2 = this->byte_index;
          this->byte_index = uVar2 + 1;
          bVar5 = this->byte_buffer[uVar2];
          this->bit_buffer = bVar5;
          uVar8 = uVar8 << 8 | (ulong)bVar5;
        } while (cVar7 != '\0');
      }
      if (this->eof == true) {
        this->bit_buffer = '\0';
      }
      if (this->byte_index == this->current_buffer_length) {
        sVar3 = fread(this->byte_buffer,1,this->buffer_size,(FILE *)this->file);
        bVar9 = sVar3 == 0;
        if (bVar9) {
          sVar3 = this->current_buffer_length;
        }
        this->current_buffer_length = sVar3;
        this->eof = bVar9;
        this->byte_index = 0;
      }
      uVar2 = this->byte_index;
      this->byte_index = uVar2 + 1;
      sVar4 = (sbyte)(bVar6 & 7);
      bVar1 = this->byte_buffer[uVar2];
      this->bit_count = '\b';
      bVar5 = 8 - sVar4;
      uVar8 = (ulong)(byte)((reverse_bit_masks[bVar6 & 7] & bVar1) >> (bVar5 & 0x1f)) +
              (uVar8 << sVar4);
      this->bit_buffer = bVar1 << sVar4;
    }
    else {
      uVar8 = (ulong)(byte)((reverse_bit_masks[(ulong)(uint)__fd & 0xff] & this->bit_buffer) >>
                           (8 - bVar6 & 0x1f));
      this->bit_buffer = this->bit_buffer << (bVar6 & 0x1f);
      bVar5 = bVar5 - bVar6;
    }
    this->bit_count = bVar5;
    return uVar8 & *(ulong *)(ui64_masks + ((ulong)(uint)__fd & 0xff) * 8);
  }
  return 0;
}

Assistant:

uint64_t bitio_stream::read(uint8_t n) {
    if (n == 0) {
        return 0;
    }

    uint64_t value = 0;
    if (bit_count == 0) {
        load_byte();
        bit_count = 8;
    }

    if (bit_count >= n) {
        value += (bit_buffer & reverse_bit_masks[n]) >> (8 - n);
        bit_buffer <<= n;
        bit_count -= n;
    } else {
        value += bit_buffer >> (8 - bit_count);
        char target_bits = n - bit_count;
        char nbytes = target_bits >> 3;
        bit_buffer = 0;
        bit_count = 0;

        while (nbytes--) {
            load_byte();
            value <<= 8;
            value += bit_buffer;
        }
        load_byte();
        bit_count = 8;

        char rembits = target_bits & bit_masks[3];

        value <<= rembits;
        value += (bit_buffer & reverse_bit_masks[rembits]) >> (8 - rembits);
        bit_buffer <<= rembits;
        bit_count -= rembits;
    }
    return value & ui64_masks[n];
}